

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,
                            JSON<pstack::Procman::StackFrame,_pstack::Procman::Process_*> *jt)

{
  StackFrame *this;
  undefined1 auVar1 [8];
  JObject *pJVar2;
  undefined1 local_f8 [8];
  PrintableFrame pframe;
  long *local_90;
  long local_80 [2];
  char local_70;
  undefined1 local_68 [8];
  ProcessLocation location;
  undefined1 local_38 [8];
  JObject jo;
  
  this = jt->object;
  Procman::StackFrame::scopeIP((ProcessLocation *)local_68,this,*jt->context);
  Procman::PrintableFrame::PrintableFrame((PrintableFrame *)local_f8,*jt->context,this);
  jo.os = (ostream *)0x1337df;
  local_38 = (undefined1  [8])os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  pframe.inlined.super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)Procman::StackFrame::rawIP(this);
  jo.sep._7_1_ = 0;
  pJVar2 = JObject::field<char[3],unsigned_long,char>
                     ((JObject *)local_38,(char (*) [3])"ip",
                      (unsigned_long *)
                      &pframe.inlined.
                       super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(char *)((long)&jo.sep + 7)
                     );
  jo.sep._3_1_ = 0;
  pJVar2 = JObject::field<char[7],unsigned_long,char>
                     (pJVar2,(char (*) [7])"offset",
                      (unsigned_long *)(pframe.dieName.field_2._M_local_buf + 8),
                      (char *)((long)&jo.sep + 3));
  jo.sep._4_1_ = 0;
  pJVar2 = JObject::field<char[11],bool,char>
                     (pJVar2,(char (*) [11])0x133e93,&this->isSignalTrampoline,
                      (char *)((long)&jo.sep + 4));
  jo.sep._5_1_ = 0;
  pJVar2 = JObject::field<char[4],std::__cxx11::string,char>
                     (pJVar2,(char (*) [4])"die",
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pframe,
                      (char *)((long)&jo.sep + 5));
  if (location.location_ == 0) {
    location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)local_68 - *(long *)location.location_);
  }
  jo.sep._6_1_ = 0;
  JObject::field<char[9],unsigned_long,char>
            (pJVar2,(char (*) [9])"loadaddr",
             (unsigned_long *)
             &location.codeloc.
              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(char *)((long)&jo.sep + 6));
  Procman::ProcessLocation::symbol_abi_cxx11_
            ((MaybeNamedSymbol *)
             &pframe.inlined.
              super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ProcessLocation *)local_68);
  if (local_70 == '\x01') {
    location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         location.codeloc.
         super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi & 0xffffffffffffff00;
    JObject::field<char[7],std::pair<Elf64_Sym,std::__cxx11::string>,char>
              ((JObject *)local_38,(char (*) [7])"symbol",
               (pair<Elf64_Sym,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&pframe.inlined.
                   super__Vector_base<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
               (char *)&location.codeloc.
                        super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
  }
  else {
    jo.sep._7_1_ = 0;
    JObject::field<char[7],pstack::JsonNull,char>
              ((JObject *)local_38,(char (*) [7])"symbol",
               (JsonNull *)
               &location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(char *)((long)&jo.sep + 7));
  }
  Procman::ProcessLocation::source_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&location.codeloc.
                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(ProcessLocation *)local_68);
  jo.sep._7_1_ = 0;
  JObject::
  field<char[7],std::vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>,char>
            ((JObject *)local_38,(char (*) [7])"source",
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&location.codeloc.
                 super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(char *)((long)&jo.sep + 7));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             *)&location.codeloc.
                super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  auVar1 = local_38;
  if (local_70 == '\x01') {
    local_70 = '\0';
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
  }
  JObject::~JObject((JObject *)local_38);
  std::vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_>::~vector
            ((vector<pstack::Dwarf::DIE,_std::allocator<pstack::Dwarf::DIE>_> *)&pframe.frame);
  if (pframe.proc != (Process *)&pframe.dieName._M_string_length) {
    operator_delete(pframe.proc,pframe.dieName._M_string_length + 1);
  }
  if (location.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               location.codeloc.
               super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  return (ostream *)auVar1;
}

Assistant:

std::ostream &
operator << (std::ostream &os, const JSON<Procman::StackFrame, Procman::Process *> &jt)
{
    auto &frame =jt.object;
    Procman::ProcessLocation location = frame.scopeIP(*jt.context);
    Procman::PrintableFrame pframe(*jt.context, frame);

    JObject jo(os);
    jo
        .field("ip", frame.rawIP())
        .field("offset", pframe.functionOffset)
        .field("trampoline", frame.isSignalTrampoline)
        .field("die", pframe.dieName)
        .field("loadaddr", location.elfReloc())
        ;

    const auto &sym = location.symbol();
    if (sym)
        jo.field("symbol", *sym);
    else
        jo.field("symbol", JsonNull());

    jo.field("source", location.source());

    return jo;
}